

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

int __thiscall TPZMatrix<int>::MatrixNorm(TPZMatrix<int> *this,int p,int64_t numiter,REAL tol)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int64_t iVar4;
  int64_t iVar5;
  ostream *poVar6;
  void *pvVar7;
  int *piVar8;
  long in_RDX;
  int in_ESI;
  TPZBaseMatrix *in_RDI;
  double in_XMM0_Qa;
  __type_conflict _Var9;
  TPZVec<int> *this_00;
  bool result;
  TPZVec<int> EigenVal;
  int sum_2;
  TPZVec<int> ROW;
  int64_t k;
  int64_t j_2;
  int64_t i_2;
  TPZFMatrix<int> transp;
  REAL sum_1;
  int64_t j_1;
  int64_t i_1;
  int max_1;
  REAL sum;
  int64_t j;
  int64_t i;
  int max;
  int64_t n;
  int64_t in_stack_fffffffffffffdc8;
  TPZVec<int> *in_stack_fffffffffffffdd0;
  int64_t in_stack_fffffffffffffde0;
  int64_t in_stack_fffffffffffffde8;
  TPZFMatrix<int> *in_stack_fffffffffffffdf0;
  int64_t in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  TPZFMatrix<int> *in_stack_fffffffffffffe10;
  TPZVec<int> local_170;
  int local_14c;
  TPZVec<int> local_148;
  int64_t local_118;
  long local_110;
  long local_108;
  TPZVec<int> *in_stack_ffffffffffffff20;
  REAL *in_stack_ffffffffffffff28;
  int64_t *in_stack_ffffffffffffff30;
  TPZMatrix<int> *in_stack_ffffffffffffff38;
  double local_70;
  long local_68;
  long local_60;
  int local_54;
  double local_50;
  long local_48;
  long local_40;
  int local_34;
  int local_4;
  
  iVar4 = TPZBaseMatrix::Rows(in_RDI);
  if (iVar4 == 0) {
    local_4 = 0;
  }
  else {
    iVar5 = TPZBaseMatrix::Cols(in_RDI);
    if (iVar4 != iVar5) {
      poVar6 = std::operator<<((ostream *)&std::cerr,
                               "TVar TPZMatrix<int>::MatrixNorm(int, int64_t, REAL) const [T = int]"
                              );
      poVar6 = std::operator<<(poVar6," - matrix must be square - Rows() = ");
      iVar5 = TPZBaseMatrix::Rows(in_RDI);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar5);
      poVar6 = std::operator<<(poVar6," - Cols() = ");
      iVar5 = TPZBaseMatrix::Cols(in_RDI);
      pvVar7 = (void *)std::ostream::operator<<(poVar6,iVar5);
      std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
    }
    if (in_ESI == 0) {
      local_34 = 0;
      for (local_40 = 0; local_40 < iVar4; local_40 = local_40 + 1) {
        local_50 = 0.0;
        for (local_48 = 0; local_48 < iVar4; local_48 = local_48 + 1) {
          iVar2 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x21])(in_RDI,local_40,local_48);
          _Var9 = std::fabs<int>(iVar2);
          local_50 = _Var9 + local_50;
        }
        _Var9 = std::fabs<int>(local_34);
        if (_Var9 < local_50) {
          local_34 = (int)local_50;
        }
      }
      local_4 = local_34;
    }
    else if (in_ESI == 1) {
      local_54 = 0;
      for (local_60 = 0; local_60 < iVar4; local_60 = local_60 + 1) {
        local_70 = 0.0;
        for (local_68 = 0; local_68 < iVar4; local_68 = local_68 + 1) {
          iVar2 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x21])(in_RDI,local_68,local_60);
          _Var9 = std::fabs<int>(iVar2);
          local_70 = _Var9 + local_70;
        }
        _Var9 = std::fabs<int>(local_54);
        if (_Var9 < local_70) {
          local_54 = (int)local_70;
        }
      }
      local_4 = local_54;
    }
    else if (in_ESI == 2) {
      TPZFMatrix<int>::TPZFMatrix
                (in_stack_fffffffffffffe10,
                 CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                 in_stack_fffffffffffffe00);
      for (local_108 = 0; local_108 < iVar4; local_108 = local_108 + 1) {
        for (local_110 = 0; local_110 < iVar4; local_110 = local_110 + 1) {
          iVar2 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x21])(in_RDI,local_110,local_108);
          piVar8 = TPZFMatrix<int>::operator()
                             (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                              in_stack_fffffffffffffde0);
          *piVar8 = iVar2;
        }
      }
      TPZVec<int>::TPZVec(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
      for (local_108 = 0; local_108 < iVar4; local_108 = local_108 + 1) {
        for (local_110 = 0; local_110 < iVar4; local_110 = local_110 + 1) {
          piVar8 = TPZFMatrix<int>::operator()
                             (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                              in_stack_fffffffffffffde0);
          iVar2 = *piVar8;
          piVar8 = TPZVec<int>::operator[](&local_148,local_110);
          *piVar8 = iVar2;
        }
        for (local_110 = 0; local_110 < iVar4; local_110 = local_110 + 1) {
          local_14c = 0;
          for (local_118 = 0; local_118 < iVar4; local_118 = local_118 + 1) {
            piVar8 = TPZVec<int>::operator[](&local_148,local_118);
            iVar2 = *piVar8;
            iVar3 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x21])(in_RDI,local_118,local_110)
            ;
            local_14c = iVar2 * iVar3 + local_14c;
          }
          iVar2 = local_14c;
          piVar8 = TPZFMatrix<int>::operator()
                             (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                              in_stack_fffffffffffffde0);
          *piVar8 = iVar2;
        }
      }
      TPZVec<int>::TPZVec(&local_170);
      bVar1 = SolveEigenvaluesJacobi
                        (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                         in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
      if (!bVar1) {
        poVar6 = std::operator<<((ostream *)&std::cerr,
                                 "TVar TPZMatrix<int>::MatrixNorm(int, int64_t, REAL) const [T = int]"
                                );
        poVar6 = std::operator<<(poVar6," - it was not possible to find Eigenvalues. Iterations = ")
        ;
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,in_RDX);
        poVar6 = std::operator<<(poVar6," - error found = ");
        pvVar7 = (void *)std::ostream::operator<<(poVar6,in_XMM0_Qa);
        std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
      }
      TPZVec<int>::operator[](&local_170,0);
      this_00 = (TPZVec<int> *)std::sqrt<int>(0);
      local_4 = (int)(double)this_00;
      TPZVec<int>::~TPZVec(this_00);
      TPZVec<int>::~TPZVec(this_00);
      TPZFMatrix<int>::~TPZFMatrix((TPZFMatrix<int> *)0x12ef514);
    }
    else {
      poVar6 = std::operator<<((ostream *)&std::cerr,
                               "TVar TPZMatrix<int>::MatrixNorm(int, int64_t, REAL) const [T = int]"
                              );
      poVar6 = std::operator<<(poVar6," p = ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,in_ESI);
      poVar6 = std::operator<<(poVar6," is not a correct option");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

TVar TPZMatrix<TVar>::MatrixNorm(int p, int64_t numiter, REAL tol) const{
	const int64_t n = this->Rows();
	if (!n) return 0.;
	if (n != this->Cols()){
		PZError << __PRETTY_FUNCTION__
		<< " - matrix must be square - Rows() = "
		<< this->Rows() << " - Cols() = "
		<< this->Cols() << std::endl;
	}
	switch(p){
		case 0:{
			TVar max = 0.;
			int64_t i, j;
			for(i = 0; i < n; i++){
				REAL sum = 0.;
				for(j = 0; j < n; j++) sum += fabs( this->Get(i,j) );
				if (sum > fabs(max)) max = sum;
			}
			return max;
		}
		case 1:{
			TVar max = 0.;
			int64_t i, j;
			for(i = 0; i < n; i++){
				REAL sum = 0.;
				for(j = 0; j < n; j++) sum += fabs( this->Get(j,i) );
				if (sum > fabs(max)) max = sum;
			}
			return max;
		}
		case 2:{
			TPZFMatrix<TVar> transp(n,n);
			int64_t i, j, k;
			//TRANSPOSE
			for(i = 0; i < n; i++) for(j = 0; j < n; j++) transp(i,j) = this->Get(j,i);
			//MULTIPLY transp = transp.this
			TPZVec<TVar> ROW(n);
			for(i = 0; i < n; i++){
				for(j = 0; j < n; j++) ROW[j] = transp(i,j);
				for(j = 0; j < n; j++){
					TVar sum = 0.;
					for(k = 0; k < n; k++){
						sum += ROW[k] * this->Get(k,j);
					}//for k
					transp(i,j) = sum;
				}//for j
			}//for i
			
			TPZVec<TVar> EigenVal;
			bool result = transp.SolveEigenvaluesJacobi(numiter, tol, &EigenVal);
			if (result == false) PZError << __PRETTY_FUNCTION__
				<< " - it was not possible to find Eigenvalues. Iterations = "
				<< numiter << " - error found = " << tol << std::endl;
			return sqrt(EigenVal[0]);
		}//case 2
		default:{
			PZError << __PRETTY_FUNCTION__ << " p = " << p << " is not a correct option" << std::endl;
		}
	}//switch
	return 0.;
}